

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PInt::WriteValue(PInt *this,FArchive *ar,void *addr)

{
  int iVar1;
  BYTE BVar2;
  DWORD val;
  ulong val_00;
  BYTE out [2];
  
  iVar1 = *(int *)&this->field_0x24;
  if (iVar1 == 1) {
    val_00 = (ulong)*addr;
    goto LAB_004484c2;
  }
  if (this->Unsigned != true) {
    if (iVar1 == 4) {
      val_00 = (ulong)*addr;
LAB_0044856a:
      val = (DWORD)val_00;
      if ((int)(short)val_00 != val) {
        BVar2 = '\x04';
        goto LAB_00448575;
      }
    }
    else {
      if (iVar1 == 8) {
        val_00 = *addr;
        if ((long)(int)val_00 != val_00) {
          BVar2 = '\x06';
          goto LAB_0044853c;
        }
        goto LAB_0044856a;
      }
      val_00 = (ulong)(uint)(int)*addr;
    }
    if ((int)(char)val_00 != (int)val_00) {
      BVar2 = '\x02';
      goto LAB_004485b8;
    }
    goto LAB_004484c2;
  }
  if (iVar1 == 4) {
    val_00 = (ulong)*addr;
LAB_0044855a:
    val = (DWORD)val_00;
    if (0xffff < val) {
      BVar2 = '\x05';
LAB_00448575:
      FArchive::WriteByte(ar,BVar2);
      FArchive::WriteInt32(ar,val);
      return;
    }
  }
  else {
    if (iVar1 == 8) {
      val_00 = *addr;
      if (val_00 >> 0x20 != 0) {
        BVar2 = '\a';
LAB_0044853c:
        FArchive::WriteByte(ar,BVar2);
        FArchive::WriteInt64(ar,val_00);
        return;
      }
      goto LAB_0044855a;
    }
    val_00 = (ulong)*addr;
  }
  if (0xff < (uint)val_00) {
    BVar2 = '\x03';
LAB_004485b8:
    FArchive::WriteByte(ar,BVar2);
    FArchive::WriteInt16(ar,(WORD)val_00);
    return;
  }
LAB_004484c2:
  if ((byte)val_00 < 2) {
    FArchive::WriteByte(ar,(byte)val_00 | 8);
    return;
  }
  (*ar->_vptr_FArchive[2])(ar,out,2);
  return;
}

Assistant:

void PInt::WriteValue(FArchive &ar, const void *addr) const
{
	BYTE bval;

	// The process for bytes is the same whether signed or unsigned, since
	// they can't be compacted into a representation with fewer bytes.
	if (Size == 1)
	{
		bval = *(BYTE *)addr;
	}
	else if (Unsigned)
	{
		unsigned val;
		if (Size == 8)
		{
			QWORD qval = *(QWORD *)addr;
			if (qval & 0xFFFFFFFF00000000llu)
			{ // Value needs 64 bits
				ar.WriteByte(VAL_UInt64);
				ar.WriteInt64(qval);
				return;
			}
			// Value can fit in 32 bits or less
			val = (unsigned)qval;
			goto check_u32;
		}
		else if (Size == 4)
		{
			val = *(DWORD *)addr;
check_u32:	if (val & 0xFFFF0000u)
			{ // Value needs 32 bits
				ar.WriteByte(VAL_UInt32);
				ar.WriteInt32(val);
				return;
			}
			// Value can fit in 16 bits or less
			goto check_u16;
		}
		else// if (Size == 2)
		{
			val = *(WORD *)addr;
check_u16:	if (val & 0xFFFFFF00u)
			{ // Value needs 16 bits
				ar.WriteByte(VAL_UInt16);
				ar.WriteInt16(val);
				return;
			}
			// Value can fit in 8 bits
			bval = (BYTE)val;
		}
	}
	else // Signed
	{
		int val;
		if (Size == 8)
		{
			SQWORD qval = *(SQWORD *)addr;
			INT_MIN;
			if (qval < (-0x7FFFFFFF - 1) || qval > 0x7FFFFFFF)
			{ // Value needs 64 bits
				ar.WriteByte(VAL_Int64);
				ar.WriteInt64(qval);
				return;
			}
			// Value can fit in 32 bits or less
			val = (int)qval;
			goto check_s32;
		}
		else if (Size == 4)
		{
			val = *(SDWORD *)addr;
check_s32:	if (val < -0x8000 || val > 0x7FFF)
			{ // Value needs 32 bits
				ar.WriteByte(VAL_Int32);
				ar.WriteInt32(val);
				return;
			}
			// Value can fit in 16 bits or less
			goto check_s16;
		}
		else// if (Size == 2)
		{
			val = *(SWORD *)addr;
check_s16:	if (val < -0x80 || val > 0x7F)
			{ // Value needs 16 bits
				ar.WriteByte(VAL_Int16);
				ar.WriteInt16(val);
				return;
			}
			// Value can fit in 8 bits
			bval = (BYTE)val;
		}
	}
	// If we get here, the value fits in a byte. Values of 0 and 1 are
	// optimized away into the tag so they don't require any extra space
	// to store.
	if (bval & 0xFE)
	{
		BYTE out[2] = { Unsigned ? VAL_UInt8 : VAL_Int8, bval };
		ar.Write(out, 2);
	}
	else
	{
		ar.WriteByte(VAL_Zero + bval);
	}
}